

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O3

void test_clear(CuTest *tc)

{
  int iVar1;
  void *pvVar2;
  char *actual;
  critbit_tree cb;
  critbit_tree local_30;
  
  local_30.root = (void *)0x0;
  iVar1 = cb_insert(&local_30,"herp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x123,(char *)0x0,0,iVar1);
  pvVar2 = cb_find(&local_30,"herp",5);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c"
                ,0x124,"null pointer unexpected",(uint)(pvVar2 != (void *)0x0));
  cb_clear(&local_30);
  actual = (char *)cb_find(&local_30,"herp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x126,(char *)0x0,(char *)0x0,actual);
  iVar1 = cb_insert(&local_30,"herp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x127,(char *)0x0,0,iVar1);
  pvVar2 = cb_find(&local_30,"herp",5);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c"
                ,0x128,"null pointer unexpected",(uint)(pvVar2 != (void *)0x0));
  return;
}

Assistant:

static void test_clear(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();

  CuAssertIntEquals(tc, CB_SUCCESS, cb_insert_str(&cb, "herp"));
  CuAssertPtrNotNull(tc, cb_find_str(&cb, "herp"));
  cb_clear(&cb);
  CuAssertStrEquals(tc, NULL, cb_find_str(&cb, "herp"));
  CuAssertIntEquals(tc, CB_SUCCESS, cb_insert_str(&cb, "herp"));
  CuAssertPtrNotNull(tc, cb_find_str(&cb, "herp"));
}